

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O1

void __thiscall Gluco::Solver::toDimacs(Solver *this,FILE *f,vec<Gluco::Lit> *assumps)

{
  int iVar1;
  uint *puVar2;
  bool bVar3;
  Var VVar4;
  char *pcVar5;
  long lVar6;
  FILE *f_00;
  int x;
  int iVar7;
  uint uVar8;
  Clause *c;
  long lVar9;
  Var max;
  vec<int> map;
  uint local_5c;
  vec<int> local_58;
  uint *local_40;
  FILE *local_38;
  
  if (this->ok == false) {
    fwrite("p cnf 1 2\n1 0\n-1 0\n",0x13,1,(FILE *)f);
    return;
  }
  local_58.data = (int *)0x0;
  local_58.sz = 0;
  local_58.cap = 0;
  local_5c = 0;
  lVar6 = (long)(this->clauses).sz;
  local_38 = (FILE *)f;
  if (lVar6 < 1) {
    iVar7 = 0;
  }
  else {
    local_40 = (this->clauses).data;
    puVar2 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
    uVar8 = (this->ca).super_RegionAllocator<unsigned_int>.sz;
    lVar9 = 0;
    iVar7 = 0;
    do {
      if (uVar8 <= local_40[lVar9]) goto LAB_005c0982;
      bVar3 = satisfied(this,(Clause *)(puVar2 + local_40[lVar9]));
      iVar7 = iVar7 + (uint)!bVar3;
      lVar9 = lVar9 + 1;
    } while (lVar6 != lVar9);
  }
  if (0 < (this->clauses).sz) {
    lVar6 = 0;
    do {
      uVar8 = (this->clauses).data[lVar6];
      if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= uVar8) goto LAB_005c0982;
      c = (Clause *)((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar8);
      bVar3 = satisfied(this,c);
      if ((!bVar3) && (0 < *(int *)&(c->header).field_0x4)) {
        lVar9 = 0;
        do {
          iVar1 = *(int *)(&c[1].header.field_0x0 + lVar9 * 4);
          x = iVar1 >> 1;
          if (((byte)iVar1 & 1 ^ (this->assigns).data[x].value) != 1) {
            mapVar(x,&local_58,(Var *)&local_5c);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < *(int *)&(c->header).field_0x4);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->clauses).sz);
  }
  f_00 = local_38;
  uVar8 = iVar7 + (this->assumptions).sz;
  local_40 = (uint *)CONCAT44(local_40._4_4_,uVar8);
  fprintf(local_38,"p cnf %d %d\n",(ulong)local_5c,(ulong)uVar8);
  if (0 < (this->assumptions).sz) {
    lVar6 = 0;
    do {
      uVar8 = (this->assumptions).data[lVar6].x;
      if (((byte)uVar8 & 1 ^ (this->assigns).data[(int)uVar8 >> 1].value) == 1) {
        __assert_fail("value(assumptions[i]) != l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Glucose.cpp"
                      ,0x55b,"void Gluco::Solver::toDimacs(FILE *, const vec<Lit> &)");
      }
      VVar4 = mapVar((int)uVar8 >> 1,&local_58,(Var *)&local_5c);
      f_00 = local_38;
      pcVar5 = "-";
      if ((uVar8 & 1) == 0) {
        pcVar5 = "";
      }
      fprintf(local_38,"%s%d 0\n",pcVar5,(ulong)(VVar4 + 1));
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->assumptions).sz);
  }
  if (0 < (this->clauses).sz) {
    lVar6 = 0;
    do {
      uVar8 = (this->clauses).data[lVar6];
      if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= uVar8) {
LAB_005c0982:
        __assert_fail("r >= 0 && r < sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Alloc.h"
                      ,0x42,
                      "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]")
        ;
      }
      toDimacs(this,(FILE *)f_00,
               (Clause *)((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar8),&local_58,
               (Var *)&local_5c);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->clauses).sz);
  }
  if (0 < this->verbosity) {
    printf("Wrote %d clauses with %d variables.\n",(ulong)local_40 & 0xffffffff,(ulong)local_5c);
  }
  if (local_58.data != (int *)0x0) {
    local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
    free(local_58.data);
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE* f, const vec<Lit>& assumps)
{
    // Handle case when solver is in contradictory state:
    if (!ok){
        fprintf(f, "p cnf 1 2\n1 0\n-1 0\n");
        return; }

    vec<Var> map; Var max = 0;

    // Cannot use removeClauses here because it is not safe
    // to deallocate them at this point. Could be improved.
    int i, cnt = 0;
    for (i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]]))
            cnt++;
        
    for (i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]])){
            Clause& c = ca[clauses[i]];
            for (int j = 0; j < c.size(); j++)
                if (value(c[j]) != l_False)
                    mapVar(var(c[j]), map, max);
        }

    // Assumptions are added as unit clauses:
    cnt += assumptions.size();

    fprintf(f, "p cnf %d %d\n", max, cnt);

    for (i = 0; i < assumptions.size(); i++){
        assert(value(assumptions[i]) != l_False);
        fprintf(f, "%s%d 0\n", sign(assumptions[i]) ? "-" : "", mapVar(var(assumptions[i]), map, max)+1);
    }

    for (i = 0; i < clauses.size(); i++)
        toDimacs(f, ca[clauses[i]], map, max);

    if (verbosity > 0)
        printf("Wrote %d clauses with %d variables.\n", cnt, max);
}